

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O3

void calc_param_inertia2ff(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined4 uVar3;
  long lVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  
  dVar9 = g_P[0x29][0] / (g_P[0x12][0] * g_P[0x12][0]);
  dVar7 = g_P[0x28][0] * 0.5 + dVar9;
  auVar8._0_8_ = dVar7 * g_P[0xf][0] * g_P[0xf][0] * 0.5 +
                 g_P[9][0] * g_P[9][0] * g_P[0x2a][0] + g_P[0x2b][0];
  auVar8._8_8_ = dVar7 * g_P[0xf][1] * g_P[0xf][1] * 0.5 +
                 g_P[9][1] * g_P[9][1] * g_P[0x2a][1] + g_P[0x2b][1];
  auVar1._8_8_ = ABS(g_P[9][1]);
  auVar1._0_8_ = ABS(g_P[9][0]);
  g_P[0x3d]._0_16_ = divpd(auVar8,auVar1);
  auVar10._0_8_ = g_P[0xf][1] * g_P[0xf][0] * 0.5 * (g_P[0x28][0] * 0.5 - dVar9);
  g_P[0x30][0] = g_P[0x3d][0];
  g_P[0x31][0] = g_P[0x3d][1];
  auVar10._8_8_ = auVar10._0_8_;
  auVar2._8_8_ = ABS(g_P[9][1]);
  auVar2._0_8_ = ABS(g_P[9][0]);
  g_P[0x3e]._0_16_ = divpd(auVar10,auVar2);
  g_P[0x32][0] = g_P[0x3e][0];
  g_P[0x33][0] = g_P[0x3e][1];
  if (((g_P_changed[0x29][0] != 0 || g_P_changed[0x28][0] != 0) ||
      (auVar6._0_4_ = -(uint)(g_P_changed[0x2b][0] == 0 && g_P_changed[9][0] == 0),
      auVar6._4_4_ = -(uint)(g_P_changed[0x2b][1] == 0 && g_P_changed[9][1] == 0),
      auVar6._8_4_ = -(uint)(g_P_changed[0xf][0] == 0 && g_P_changed[0x2a][0] == 0),
      auVar6._12_4_ = -(uint)(g_P_changed[0xf][1] == 0 && g_P_changed[0x2a][1] == 0),
      uVar3 = movmskps(0,auVar6), (char)uVar3 != '\x0f')) || (g_P_changed[0x12][0] != 0)) {
    g_P_changed[0x30][0] = 1;
    g_P_changed[0x31][0] = 1;
    g_P_changed[0x32][0] = 1;
    g_P_changed[0x33][0] = 1;
    g_P_changed[0x3d][0] = 1;
    g_P_changed[0x3d][1] = 1;
    g_P_changed[0x3e][0] = 1;
    g_P_changed[0x3e][1] = 1;
  }
  lVar4 = 0;
  do {
    if ((g_param.motor_enable[lVar4] != 0) && (g_P[0x3b][lVar4] <= 0.0)) {
      g_P[0x3d][lVar4] =
           g_P[0x2a][lVar4] * ABS(g_P[9][lVar4]) + g_P[0x2b][lVar4] / ABS(g_P[9][lVar4]);
      g_P[0x3e][lVar4] = 0.0;
      if ((g_P_changed[9][lVar4] != 0) ||
         ((g_P_changed[0x2a][lVar4] != 0 || (g_P_changed[0x2b][lVar4] != 0)))) {
        g_P_changed[0x3d][lVar4] = 1;
        g_P_changed[0x3e][lVar4] = 1;
      }
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  uVar5 = 0;
  do {
    if (g_param.motor_enable[uVar5] != 0) {
      yprintf(OUTPUT_LV_DEBUG," LOAD_INERTIA_SELF[%d]  %f\n",g_P[0x3d][uVar5],uVar5 & 0xffffffff);
      yprintf(OUTPUT_LV_DEBUG," LOAD_INERTIA_CROSS[%d] %f\n",g_P[0x3e][uVar5],uVar5 & 0xffffffff);
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x10);
  return;
}

Assistant:

void calc_param_inertia2ff(void)
{
  int i;
  double A, B, C, D;  // 制御パラメータ
  double M, J;        // ロボットの質量、慣性モーメント
  double Gr, Gl;      // ギア比
  double Jmr, Jml;    // モータの慣性モーメント
  double Jtr, Jtl;    // タイヤの慣性モーメント
  double Rr, Rl;      // タイヤ半径
  double T;           // トレッド

  // パラメータの代入
  M = g_P[YP_PARAM_MASS][0];
  J = g_P[YP_PARAM_MOMENT_INERTIA][0];
  Gr = fabs(g_P[YP_PARAM_GEAR][0]);
  Gl = fabs(g_P[YP_PARAM_GEAR][1]);
  Jmr = g_P[YP_PARAM_MOTOR_M_INERTIA][0];
  Jml = g_P[YP_PARAM_MOTOR_M_INERTIA][1];
  Jtr = g_P[YP_PARAM_TIRE_M_INERTIA][0];
  Jtl = g_P[YP_PARAM_TIRE_M_INERTIA][1];
  Rr = g_P[YP_PARAM_RADIUS][0];
  Rl = g_P[YP_PARAM_RADIUS][1];
  T = g_P[YP_PARAM_TREAD][0];

  // パラメータの計算
  A = (Gr * Gr * Jmr + Jtr + Rr * Rr / 2.0 * (M / 2.0 + J / (T * T))) / Gr;
  B = (Gl * Gl * Jml + Jtl + Rl * Rl / 2.0 * (M / 2.0 + J / (T * T))) / Gl;
  C = (Rr * Rl / 2.0 * (M / 2.0 - J / (T * T))) / Gr;
  D = (Rr * Rl / 2.0 * (M / 2.0 - J / (T * T))) / Gl;

  // パラメータの設定
  g_P[YP_PARAM_GAIN_A][0] = A;
  g_P[YP_PARAM_GAIN_B][0] = B;
  g_P[YP_PARAM_GAIN_C][0] = C;
  g_P[YP_PARAM_GAIN_D][0] = D;

  g_P[YP_PARAM_INERTIA_SELF][0] = A;
  g_P[YP_PARAM_INERTIA_SELF][1] = B;
  g_P[YP_PARAM_INERTIA_CROSS][0] = C;
  g_P[YP_PARAM_INERTIA_CROSS][1] = D;

  if (ischanged_p(YP_PARAM_MASS, 0) ||
      ischanged_p(YP_PARAM_MOMENT_INERTIA, 0) ||
      ischanged_p(YP_PARAM_GEAR, 0) ||
      ischanged_p(YP_PARAM_GEAR, 1) ||
      ischanged_p(YP_PARAM_MOTOR_M_INERTIA, 0) ||
      ischanged_p(YP_PARAM_MOTOR_M_INERTIA, 1) ||
      ischanged_p(YP_PARAM_TIRE_M_INERTIA, 0) ||
      ischanged_p(YP_PARAM_TIRE_M_INERTIA, 1) ||
      ischanged_p(YP_PARAM_RADIUS, 0) ||
      ischanged_p(YP_PARAM_RADIUS, 1) ||
      ischanged_p(YP_PARAM_TREAD, 0))
  {
    g_P_changed[YP_PARAM_GAIN_A][0] = 1;
    g_P_changed[YP_PARAM_GAIN_B][0] = 1;
    g_P_changed[YP_PARAM_GAIN_C][0] = 1;
    g_P_changed[YP_PARAM_GAIN_D][0] = 1;
    g_P_changed[YP_PARAM_INERTIA_SELF][0] = 1;
    g_P_changed[YP_PARAM_INERTIA_CROSS][0] = 1;
    g_P_changed[YP_PARAM_INERTIA_SELF][1] = 1;
    g_P_changed[YP_PARAM_INERTIA_CROSS][1] = 1;
  }
  for (i = 0; i < YP_PARAM_MAX_MOTOR_NUM; i++)
  {
    if (!g_param.motor_enable[i])
      continue;
    if (p(YP_PARAM_VEHICLE_CONTROL, i) > 0)
      continue;

    g_P[YP_PARAM_INERTIA_SELF][i] =
        fabs(g_P[YP_PARAM_GEAR][i]) * g_P[YP_PARAM_MOTOR_M_INERTIA][i] + g_P[YP_PARAM_TIRE_M_INERTIA][i] / fabs(g_P[YP_PARAM_GEAR][i]);
    g_P[YP_PARAM_INERTIA_CROSS][i] = 0;

    if (ischanged_p(YP_PARAM_GEAR, i) ||
        ischanged_p(YP_PARAM_MOTOR_M_INERTIA, i) ||
        ischanged_p(YP_PARAM_TIRE_M_INERTIA, i))
    {
      g_P_changed[YP_PARAM_INERTIA_SELF][i] = 1;
      g_P_changed[YP_PARAM_INERTIA_CROSS][i] = 1;
    }
  }
  // 出力（デバッグ）
  for (i = 0; i < YP_PARAM_MAX_MOTOR_NUM; i++)
  {
    if (!g_param.motor_enable[i])
      continue;

    yprintf(OUTPUT_LV_DEBUG, " LOAD_INERTIA_SELF[%d]  %f\n", i, g_P[YP_PARAM_INERTIA_SELF][i]);
    yprintf(OUTPUT_LV_DEBUG, " LOAD_INERTIA_CROSS[%d] %f\n", i, g_P[YP_PARAM_INERTIA_CROSS][i]);
  }
}